

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O0

void drawChar(int x,int y,int c)

{
  uint8_t uVar1;
  int local_24;
  byte local_1d;
  int _x;
  uint8_t row;
  int _y;
  bool inverted;
  int c_local;
  int y_local;
  int x_local;
  
  for (_x = 0; _x < 6; _x = _x + 1) {
    local_1d = font_data[(int)((c & 0xfffffeffU) * 6 + _x)];
    if ((c & 0x100U) != 0) {
      local_1d = local_1d ^ 0xff;
    }
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      uVar1 = '\0';
      if (((uint)local_1d & 8 >> ((byte)local_24 & 0x1f)) != 0) {
        uVar1 = 0xff;
      }
      jedi_screen_buffer[x + local_24 + (y + _x) * 0x80] = uVar1;
    }
  }
  return;
}

Assistant:

static void drawChar(int x, int y, int c)
{
    bool inverted = (c & DISPLAY_INVERT);
    c &=~DISPLAY_INVERT;
    
    for(int _y=0; _y<6; _y++)
    {
        uint8_t row = font_data[c*6+_y];
        if (inverted)
            row = ~row;
        for(int _x=0; _x<4; _x++)
        {
            jedi_screen_buffer[x+_x + (y+_y) * DISPLAY_WIDTH] = (row & (0b1000 >> _x)) ? 255 : 0;
        }
    }
}